

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O0

Interval * tcu::operator+(Interval *__return_storage_ptr__,Interval *x,Interval *y)

{
  double dVar1;
  double dVar2;
  Interval *pIVar3;
  Interval **ppIVar4;
  undefined8 *puVar5;
  bool bVar6;
  deBool dVar7;
  float fVar8;
  Interval local_d8;
  Interval local_c0;
  Interval *local_a8;
  Interval *pIStack_a0;
  Interval *local_98;
  Interval **local_90;
  Interval *p_1;
  double dStack_80;
  double local_78;
  undefined8 *local_70;
  Interval *p;
  Interval p_hi_;
  undefined1 auStack_40 [8];
  Interval p_lo_;
  Interval *p_dst_;
  Interval *pIStack_18;
  ScopedRoundingMode p_ctx_;
  Interval *y_local;
  Interval *x_local;
  
  pIStack_18 = y;
  Interval::Interval(__return_storage_ptr__);
  bVar6 = Interval::empty(x);
  if ((!bVar6) && (bVar6 = Interval::empty(pIStack_18), !bVar6)) {
    do {
      ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&p_dst_ + 4));
      p_lo_.m_hi = (double)__return_storage_ptr__;
      Interval::Interval((Interval *)auStack_40);
      Interval::Interval((Interval *)&p);
      local_70 = (undefined8 *)auStack_40;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar1 = Interval::lo(x);
      dVar2 = Interval::lo(pIStack_18);
      Interval::Interval((Interval *)&p_1,dVar1 + dVar2);
      puVar5 = local_70;
      local_70[2] = local_78;
      dVar1 = dStack_80;
      *puVar5 = p_1;
      puVar5[1] = dVar1;
      local_90 = &p;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar1 = Interval::hi(x);
      dVar2 = Interval::hi(pIStack_18);
      Interval::Interval((Interval *)&local_a8,dVar1 + dVar2);
      ppIVar4 = local_90;
      local_90[2] = local_98;
      pIVar3 = pIStack_a0;
      *ppIVar4 = local_a8;
      ppIVar4[1] = pIVar3;
      Interval::operator|(&local_c0,(Interval *)auStack_40,(Interval *)&p);
      *(undefined8 *)p_lo_.m_hi = local_c0._0_8_;
      *(double *)((long)p_lo_.m_hi + 8) = local_c0.m_lo;
      *(double *)((long)p_lo_.m_hi + 0x10) = local_c0.m_hi;
      ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&p_dst_ + 4));
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
  }
  bVar6 = Interval::hasNaN(x);
  if ((bVar6) || (bVar6 = Interval::hasNaN(pIStack_18), bVar6)) {
    fVar8 = std::numeric_limits<float>::quiet_NaN();
    Interval::Interval(&local_d8,(double)fVar8);
    Interval::operator|=(__return_storage_ptr__,&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval operator+ (const Interval& x, const Interval& y)
{
	Interval ret;

	if (!x.empty() && !y.empty())
		TCU_SET_INTERVAL_BOUNDS(ret, p, p = x.lo() + y.lo(), p = x.hi() + y.hi());
	if (x.hasNaN() || y.hasNaN())
		ret |= TCU_NAN;

	return ret;
}